

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixFixSize.h
# Opt level: O1

void __thiscall
iDynTree::MatrixFixSize<4U,_4U>::MatrixFixSize
          (MatrixFixSize<4U,_4U> *this,MatrixView<const_double> *other)

{
  MatrixStorageOrdering MVar1;
  pointer peVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if ((other->m_rows == 4) && (other->m_cols == 4)) {
    peVar2 = other->m_storage;
    MVar1 = other->m_storageOrder;
    lVar3 = other->m_outerStride;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        lVar7 = lVar5;
        lVar4 = lVar6;
        if (MVar1 == RowMajor) {
          lVar7 = lVar6;
          lVar4 = lVar5;
        }
        *(element_type *)((long)this + lVar6 * 8) = peVar2[lVar4 * lVar3 + lVar7];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar5 = lVar5 + 1;
      this = (MatrixFixSize<4U,_4U> *)((long)this + 0x20);
    } while (lVar5 != 4);
  }
  else {
    iDynTree::reportError("MatrixFixSize","constructor","input matrix does not have the right size")
    ;
    this->m_data[0xe] = 0.0;
    this->m_data[0xf] = 0.0;
    this->m_data[0xc] = 0.0;
    this->m_data[0xd] = 0.0;
    this->m_data[10] = 0.0;
    this->m_data[0xb] = 0.0;
    this->m_data[8] = 0.0;
    this->m_data[9] = 0.0;
    this->m_data[6] = 0.0;
    this->m_data[7] = 0.0;
    this->m_data[4] = 0.0;
    this->m_data[5] = 0.0;
    this->m_data[2] = 0.0;
    this->m_data[3] = 0.0;
    this->m_data[0] = 0.0;
    this->m_data[1] = 0.0;
  }
  return;
}

Assistant:

MatrixFixSize<nRows,nCols>::MatrixFixSize(iDynTree::MatrixView<const double> other)
    {
        if( other.rows() != nRows ||
            other.cols() != nCols )
        {
            reportError("MatrixFixSize","constructor","input matrix does not have the right size");
            this->zero();
        }
        else
        {
            for(std::size_t row=0; row < nRows; row++ )
            {
                for(std::size_t col=0; col < nCols; col++ )
                {
                    this->m_data[rawIndexRowMajor(row,col)] = other(row, col);
                }
            }
        }
    }